

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O2

int fffi4u2(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,
           unsigned_short nullval,char *nullarray,int *anynull,unsigned_short *output,int *status)

{
  long lVar1;
  unsigned_short uVar2;
  uint uVar3;
  long lVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    lVar4 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        dVar5 = (double)input[lVar4] * scale + zero;
        if (-0.49 <= dVar5) {
          if (dVar5 <= 65535.49) {
            uVar2 = (unsigned_short)(int)dVar5;
          }
          else {
            *status = -0xb;
            uVar2 = 0xffff;
          }
        }
        else {
          *status = -0xb;
          uVar2 = 0;
        }
        output[lVar4] = uVar2;
      }
    }
    else {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        uVar3 = input[lVar4];
        if ((int)uVar3 < 0) {
          *status = -0xb;
          uVar3 = 0;
        }
        else if (0xffff < uVar3) {
          *status = -0xb;
          uVar3 = 0xffff;
        }
        output[lVar4] = (unsigned_short)uVar3;
      }
    }
  }
  else {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    lVar4 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        if (input[lVar4] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar4] = nullval;
          }
          else {
            nullarray[lVar4] = '\x01';
          }
        }
        else {
          dVar5 = (double)input[lVar4] * scale + zero;
          if (-0.49 <= dVar5) {
            if (dVar5 <= 65535.49) {
              output[lVar4] = (unsigned_short)(int)dVar5;
            }
            else {
              *status = -0xb;
              output[lVar4] = 0xffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar4] = 0;
          }
        }
      }
    }
    else {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        uVar3 = input[lVar4];
        if (uVar3 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar4] = nullval;
          }
          else {
            nullarray[lVar4] = '\x01';
          }
        }
        else if ((int)uVar3 < 0) {
          *status = -0xb;
          output[lVar4] = 0;
        }
        else if (uVar3 < 0x10000) {
          output[lVar4] = (unsigned_short)uVar3;
        }
        else {
          *status = -0xb;
          output[lVar4] = 0xffff;
        }
      }
    }
  }
  return *status;
}

Assistant:

int fffi4u2(INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
   unsigned short nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned short *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > USHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = USHRT_MAX;
                }
                else
                    output[ii] = (unsigned short) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = USHRT_MAX;
                }
                else
                    output[ii] = (unsigned short) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (input[ii] < 0)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > USHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = USHRT_MAX;
                    }
                    else
                        output[ii] = (unsigned short) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = USHRT_MAX;
                    }
                    else
                        output[ii] = (unsigned short) dvalue;
                }
            }
        }
    }
    return(*status);
}